

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestSuite * __thiscall
testing::internal::UnitTestImpl::GetTestSuite
          (UnitTestImpl *this,char *test_suite_name,char *type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  reference ppTVar4;
  TestSuite *pTVar5;
  __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  char *in_RSI;
  long in_RDI;
  TestSuite *new_test_suite;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
  test_suite;
  string *in_stack_fffffffffffffea8;
  TestSuiteNameIs *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  TearDownTestSuiteFunc in_stack_ffffffffffffff20;
  TestSuiteNameIs *in_stack_ffffffffffffff28;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
  *in_stack_ffffffffffffff30;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
  *in_stack_ffffffffffffff38;
  TestSuite *in_stack_ffffffffffffff40;
  const_iterator in_stack_ffffffffffffff48;
  allocator local_89;
  string local_88 [112];
  char *local_18;
  TestSuite *local_8;
  
  local_18 = in_RSI;
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::rbegin
            ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
             in_stack_fffffffffffffeb8);
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::rend
            ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
             in_stack_fffffffffffffeb8);
  pcVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,pcVar1,&local_89);
  TestSuiteNameIs::TestSuiteNameIs(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite**,std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>>>,testing::internal::TestSuiteNameIs>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  TestSuiteNameIs::~TestSuiteNameIs((TestSuiteNameIs *)0x12efda);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::rend
            ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
             in_stack_fffffffffffffeb8);
  bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
                           *)in_stack_fffffffffffffeb0,
                          (reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
                           *)in_stack_fffffffffffffea8);
  if (bVar2) {
    ppTVar4 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
                           *)in_stack_fffffffffffffeb0);
    local_8 = *ppTVar4;
  }
  else {
    pTVar5 = (TestSuite *)operator_new(0x108);
    TestSuite::TestSuite
              (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,
               (char *)in_stack_ffffffffffffff30,(SetUpTestSuiteFunc)in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff30,local_18,(allocator *)&stack0xffffffffffffff2f);
    bVar3 = UnitTestOptions::MatchesFilter
                      (in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
    if ((bVar3 & 1) == 0) {
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::push_back
                ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                 CONCAT17(bVar3,in_stack_fffffffffffffec0),(value_type *)in_stack_fffffffffffffeb8);
    }
    else {
      *(int *)(in_RDI + 0x164) = *(int *)(in_RDI + 0x164) + 1;
      this_00 = (__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                 *)(in_RDI + 0xb8);
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                 in_stack_fffffffffffffea8);
      __gnu_cxx::
      __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
      ::operator+(this_00,(difference_type)in_stack_fffffffffffffeb0);
      __gnu_cxx::
      __normal_iterator<testing::TestSuite*const*,std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>>
      ::__normal_iterator<testing::TestSuite**>
                ((__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                  *)in_stack_fffffffffffffeb0,
                 (__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                  *)in_stack_fffffffffffffea8);
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::insert
                ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,
                 (value_type *)in_stack_ffffffffffffff38);
    }
    this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xd0);
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd0));
    std::vector<int,_std::allocator<int>_>::push_back
              (this_01,(value_type_conflict2 *)in_stack_fffffffffffffea8);
    local_8 = pTVar5;
  }
  return local_8;
}

Assistant:

TestSuite* UnitTestImpl::GetTestSuite(
    const char* test_suite_name, const char* type_param,
    internal::SetUpTestSuiteFunc set_up_tc,
    internal::TearDownTestSuiteFunc tear_down_tc) {
  // Can we find a TestSuite with the given name?
  const auto test_suite =
      std::find_if(test_suites_.rbegin(), test_suites_.rend(),
                   TestSuiteNameIs(test_suite_name));

  if (test_suite != test_suites_.rend()) return *test_suite;

  // No.  Let's create one.
  auto* const new_test_suite =
      new TestSuite(test_suite_name, type_param, set_up_tc, tear_down_tc);

  // Is this a death test suite?
  if (internal::UnitTestOptions::MatchesFilter(test_suite_name,
                                               kDeathTestSuiteFilter)) {
    // Yes.  Inserts the test suite after the last death test suite
    // defined so far.  This only works when the test suites haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_suite_;
    test_suites_.insert(test_suites_.begin() + last_death_test_suite_,
                        new_test_suite);
  } else {
    // No.  Appends to the end of the list.
    test_suites_.push_back(new_test_suite);
  }

  test_suite_indices_.push_back(static_cast<int>(test_suite_indices_.size()));
  return new_test_suite;
}